

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofConstraint.cpp
# Opt level: O2

int __thiscall
btGeneric6DofConstraint::get_limit_motor_info2
          (btGeneric6DofConstraint *this,btRotationalLimitMotor *limot,btTransform *transA,
          btTransform *transB,btVector3 *linVelA,btVector3 *linVelB,btVector3 *angVelA,
          btVector3 *angVelB,btConstraintInfo2 *info,int row,btVector3 *ax1,int rotational,
          int rotAllowed)

{
  btVector3 *v1;
  bool bVar1;
  int iVar2;
  btScalar *pbVar3;
  btScalar *pbVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  float fVar9;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  float extraout_XMM0_Dd;
  float extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  float fVar10;
  btScalar bVar11;
  undefined4 in_XMM1_Dc;
  float fVar12;
  float fVar13;
  undefined4 in_XMM1_Dd;
  float fVar14;
  float fVar15;
  float fVar16;
  btScalar bVar17;
  btVector3 bVar18;
  btVector3 bVar19;
  btVector3 local_108;
  undefined1 local_f8 [16];
  btVector3 *local_e8;
  btVector3 *local_e0;
  undefined1 local_d8 [8];
  float fStack_d0;
  float fStack_cc;
  btScalar local_c0 [4];
  float local_ac;
  btVector3 local_a8;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  btVector3 local_40;
  
  bVar1 = limot->m_enableMotor;
  iVar2 = limot->m_currentLimit;
  iVar5 = 0;
  if ((iVar2 != 0 | bVar1) == 1) {
    lVar7 = (long)row * (long)info->rowskip;
    lVar6 = (long)(int)lVar7;
    bVar8 = rotational != 0;
    pbVar4 = (&info->m_J1linearAxis)[bVar8];
    pbVar3 = (&info->m_J2linearAxis)[bVar8];
    pbVar4[lVar7] = ax1->m_floats[0];
    pbVar4[lVar6 + 1] = ax1->m_floats[1];
    pbVar4[lVar6 + 2] = ax1->m_floats[2];
    pbVar3[lVar7] = -ax1->m_floats[0];
    pbVar3[lVar6 + 1] = -ax1->m_floats[1];
    pbVar3[lVar6 + 2] = -ax1->m_floats[2];
    if (!bVar8) {
      local_e8 = linVelA;
      local_e0 = linVelB;
      if (this->m_useOffsetForConstraintFrame == true) {
        local_a8 = operator-(&(this->m_calculatedTransformB).m_origin,&transB->m_origin);
        local_108.m_floats[0] =
             local_a8.m_floats[2] * ax1->m_floats[2] +
             ax1->m_floats[0] * local_a8.m_floats[0] + local_a8.m_floats[1] * ax1->m_floats[1];
        bVar18 = operator*(ax1,local_108.m_floats);
        local_68._8_4_ = extraout_XMM0_Dc;
        local_68._0_8_ = bVar18.m_floats._0_8_;
        local_68._12_4_ = extraout_XMM0_Dd;
        local_58._8_4_ = in_XMM1_Dc;
        local_58._0_8_ = bVar18.m_floats._8_8_;
        local_58._12_4_ = in_XMM1_Dd;
        local_f8 = ZEXT416((uint)(local_a8.m_floats[2] - bVar18.m_floats[2]));
        fVar12 = 0.0 - extraout_XMM0_Dc;
        fVar14 = 0.0 - extraout_XMM0_Dd;
        local_d8._4_4_ = local_a8.m_floats[1] - bVar18.m_floats[1];
        local_d8._0_4_ = local_a8.m_floats[0] - bVar18.m_floats[0];
        fStack_d0 = fVar12;
        fStack_cc = fVar14;
        local_40 = operator-(&(this->m_calculatedTransformA).m_origin,&transA->m_origin);
        local_108.m_floats[0] =
             local_40.m_floats[2] * ax1->m_floats[2] +
             ax1->m_floats[0] * local_40.m_floats[0] + local_40.m_floats[1] * ax1->m_floats[1];
        bVar18 = operator*(ax1,local_108.m_floats);
        local_98._8_4_ = extraout_XMM0_Dc_00;
        local_98._0_8_ = bVar18.m_floats._0_8_;
        local_98._12_4_ = extraout_XMM0_Dd_00;
        local_88._8_4_ = fVar12;
        local_88._0_8_ = bVar18.m_floats._8_8_;
        local_88._12_4_ = fVar14;
        fVar16 = local_40.m_floats[2] - bVar18.m_floats[2];
        local_ac = limot->m_currentPosition - limot->m_currentLimitError;
        local_78 = local_40.m_floats[0] - bVar18.m_floats[0];
        fStack_74 = local_40.m_floats[1] - bVar18.m_floats[1];
        fVar13 = 0.0 - extraout_XMM0_Dc_00;
        fVar15 = 0.0 - extraout_XMM0_Dd_00;
        fStack_70 = fVar13;
        fStack_6c = fVar15;
        bVar18 = operator*(ax1,&local_ac);
        fVar14 = (bVar18.m_floats[0] + (float)local_98._0_4_) - (float)local_68._0_4_;
        fVar9 = (bVar18.m_floats[1] + (float)local_98._4_4_) - (float)local_68._4_4_;
        fVar10 = (bVar18.m_floats[2] + (float)local_88._0_4_) - (float)local_58._0_4_;
        fVar12 = this->m_factA;
        local_40.m_floats[1] = fVar12 * fVar9 + fStack_74;
        local_40.m_floats[0] = fVar12 * fVar14 + local_78;
        local_40.m_floats[2] = fVar12 * fVar10 + fVar16;
        local_40.m_floats[3] = 0.0;
        fVar12 = this->m_factB;
        local_a8.m_floats[1] = (float)local_d8._4_4_ - fVar12 * fVar9;
        local_a8.m_floats[0] = (float)local_d8._0_4_ - fVar12 * fVar14;
        local_a8.m_floats[2] = (float)local_f8._0_4_ - fVar10 * fVar12;
        local_a8.m_floats[3] = 0.0;
        local_108 = btVector3::cross(&local_40,ax1);
        fStack_d0 = (float)extraout_XMM0_Dc_01;
        local_d8 = (undefined1  [8])local_108.m_floats._0_8_;
        fStack_cc = (float)extraout_XMM0_Dd_01;
        local_f8._8_4_ = fVar13;
        local_f8._0_8_ = local_108.m_floats._8_8_;
        local_f8._12_4_ = fVar15;
        bVar19 = btVector3::cross(&local_a8,ax1);
        bVar18.m_floats = local_108.m_floats;
        local_c0[0] = bVar19.m_floats[0];
        local_c0[1] = bVar19.m_floats[1];
        local_c0[2] = bVar19.m_floats[2];
        local_c0[3] = bVar19.m_floats[3];
        if ((rotAllowed == 0) && (this->m_hasStaticBody != false)) {
          fVar12 = this->m_factA;
          local_108.m_floats[1] = fVar12 * (float)local_d8._4_4_;
          local_108.m_floats[0] = fVar12 * (float)local_d8._0_4_;
          local_108.m_floats[3] = bVar18.m_floats[3];
          local_108.m_floats[2] = (float)local_f8._0_4_ * fVar12;
          fVar12 = this->m_factB;
          local_c0[1] = fVar12 * bVar19.m_floats[1];
          local_c0[0] = fVar12 * bVar19.m_floats[0];
          local_c0[3] = bVar19.m_floats[3];
          local_c0[2] = bVar19.m_floats[2] * fVar12;
        }
        pbVar4 = info->m_J1angularAxis;
        for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
          pbVar4[lVar7 + lVar6] = local_108.m_floats[lVar6];
        }
        pbVar4 = info->m_J2angularAxis;
        for (lVar6 = 0; linVelA = local_e8, linVelB = local_e0, lVar6 != 3; lVar6 = lVar6 + 1) {
          pbVar4[lVar7 + lVar6] = -local_c0[lVar6];
        }
      }
      else {
        v1 = &(this->m_calculatedTransformB).m_origin;
        local_f8._0_8_ = v1;
        local_108 = operator-(v1,&transA->m_origin);
        bVar18 = btVector3::cross(&local_108,ax1);
        pbVar4 = info->m_J1angularAxis;
        *(long *)(pbVar4 + lVar7) = bVar18.m_floats._0_8_;
        pbVar4[lVar6 + 2] = bVar18.m_floats[2];
        local_108 = operator-((btVector3 *)local_f8._0_8_,&transB->m_origin);
        bVar18 = btVector3::cross(&local_108,ax1);
        pbVar4 = info->m_J2angularAxis;
        *(ulong *)(pbVar4 + lVar7) = bVar18.m_floats._0_8_ ^ 0x8000000080000000;
        pbVar4[lVar6 + 2] = -bVar18.m_floats[2];
        linVelA = local_e8;
        linVelB = local_e0;
      }
    }
    if (iVar2 == 0) {
      info->m_constraintError[lVar7] = 0.0;
      iVar5 = 1;
      if (bVar1 != false) {
        info->cfm[lVar7] = limot->m_normalCFM;
        bVar11 = limot->m_targetVelocity;
        if (rotational == 0) {
          bVar11 = -bVar11;
        }
        bVar11 = btTypedConstraint::getMotorFactor
                           (&this->super_btTypedConstraint,limot->m_currentPosition,limot->m_loLimit
                            ,limot->m_hiLimit,bVar11,info->fps * limot->m_stopERP);
        info->m_constraintError[lVar7] =
             bVar11 * limot->m_targetVelocity + info->m_constraintError[lVar7];
        info->m_lowerLimit[lVar7] = -limot->m_maxMotorForce;
        info->m_upperLimit[lVar7] = limot->m_maxMotorForce;
      }
    }
    else {
      fVar12 = limot->m_loLimit;
      fVar14 = limot->m_hiLimit;
      pbVar4 = info->m_constraintError;
      pbVar4[lVar7] = 0.0;
      if (bVar1 != false && fVar12 != fVar14) {
        info->cfm[lVar7] = limot->m_normalCFM;
      }
      fVar12 = info->fps * limot->m_stopERP;
      if (rotational != 0) {
        fVar12 = -fVar12;
      }
      pbVar4[lVar7] = fVar12 * limot->m_currentLimitError + pbVar4[lVar7];
      info->cfm[lVar7] = limot->m_stopCFM;
      if ((limot->m_loLimit != limot->m_hiLimit) || (NAN(limot->m_loLimit) || NAN(limot->m_hiLimit))
         ) {
        bVar11 = 0.0;
        if (iVar2 != 1) {
          bVar11 = -3.4028235e+38;
        }
        if (iVar2 == 1) {
          bVar17 = 3.4028235e+38;
        }
        else {
          bVar17 = 0.0;
        }
        info->m_lowerLimit[lVar7] = bVar11;
        info->m_upperLimit[lVar7] = bVar17;
        iVar5 = 1;
        if (0.0 < limot->m_bounce) {
          if (rotational != 0) {
            linVelB = angVelB;
            linVelA = angVelA;
          }
          bVar11 = btVector3::dot(linVelA,ax1);
          bVar17 = btVector3::dot(linVelB,ax1);
          fVar12 = bVar11 - bVar17;
          if (iVar2 == 1) {
            if (0.0 <= fVar12) {
              return 1;
            }
            fVar12 = fVar12 * -limot->m_bounce;
            pbVar4 = info->m_constraintError;
            if (fVar12 < pbVar4[lVar7] || fVar12 == pbVar4[lVar7]) {
              return 1;
            }
          }
          else {
            if (fVar12 <= 0.0) {
              return 1;
            }
            fVar12 = fVar12 * -limot->m_bounce;
            pbVar4 = info->m_constraintError;
            if (pbVar4[lVar7] <= fVar12) {
              return 1;
            }
          }
          pbVar4[lVar7] = fVar12;
        }
      }
      else {
        info->m_lowerLimit[lVar7] = -3.4028235e+38;
        info->m_upperLimit[lVar7] = 3.4028235e+38;
        iVar5 = 1;
      }
    }
  }
  return iVar5;
}

Assistant:

int btGeneric6DofConstraint::get_limit_motor_info2(
	btRotationalLimitMotor * limot,
	const btTransform& transA,const btTransform& transB,const btVector3& linVelA,const btVector3& linVelB,const btVector3& angVelA,const btVector3& angVelB,
	btConstraintInfo2 *info, int row, btVector3& ax1, int rotational,int rotAllowed)
{
    int srow = row * info->rowskip;
    int powered = limot->m_enableMotor;
    int limit = limot->m_currentLimit;
    if (powered || limit)
    {   // if the joint is powered, or has joint limits, add in the extra row
        btScalar *J1 = rotational ? info->m_J1angularAxis : info->m_J1linearAxis;
        btScalar *J2 = rotational ? info->m_J2angularAxis : info->m_J2linearAxis;
        J1[srow+0] = ax1[0];
        J1[srow+1] = ax1[1];
        J1[srow+2] = ax1[2];

        J2[srow+0] = -ax1[0];
        J2[srow+1] = -ax1[1];
        J2[srow+2] = -ax1[2];

		if((!rotational))
        {
			if (m_useOffsetForConstraintFrame)
			{
				btVector3 tmpA, tmpB, relA, relB;
				// get vector from bodyB to frameB in WCS
				relB = m_calculatedTransformB.getOrigin() - transB.getOrigin();
				// get its projection to constraint axis
				btVector3 projB = ax1 * relB.dot(ax1);
				// get vector directed from bodyB to constraint axis (and orthogonal to it)
				btVector3 orthoB = relB - projB;
				// same for bodyA
				relA = m_calculatedTransformA.getOrigin() - transA.getOrigin();
				btVector3 projA = ax1 * relA.dot(ax1);
				btVector3 orthoA = relA - projA;
				// get desired offset between frames A and B along constraint axis
				btScalar desiredOffs = limot->m_currentPosition - limot->m_currentLimitError;
				// desired vector from projection of center of bodyA to projection of center of bodyB to constraint axis
				btVector3 totalDist = projA + ax1 * desiredOffs - projB;
				// get offset vectors relA and relB
				relA = orthoA + totalDist * m_factA;
				relB = orthoB - totalDist * m_factB;
				tmpA = relA.cross(ax1);
				tmpB = relB.cross(ax1);
				if(m_hasStaticBody && (!rotAllowed))
				{
					tmpA *= m_factA;
					tmpB *= m_factB;
				}
				int i;
				for (i=0; i<3; i++) info->m_J1angularAxis[srow+i] = tmpA[i];
				for (i=0; i<3; i++) info->m_J2angularAxis[srow+i] = -tmpB[i];
			} else
			{
				btVector3 ltd;	// Linear Torque Decoupling vector
				btVector3 c = m_calculatedTransformB.getOrigin() - transA.getOrigin();
				ltd = c.cross(ax1);
				info->m_J1angularAxis[srow+0] = ltd[0];
				info->m_J1angularAxis[srow+1] = ltd[1];
				info->m_J1angularAxis[srow+2] = ltd[2];

				c = m_calculatedTransformB.getOrigin() - transB.getOrigin();
				ltd = -c.cross(ax1);
				info->m_J2angularAxis[srow+0] = ltd[0];
				info->m_J2angularAxis[srow+1] = ltd[1];
				info->m_J2angularAxis[srow+2] = ltd[2];
			}
        }
        // if we're limited low and high simultaneously, the joint motor is
        // ineffective
        if (limit && (limot->m_loLimit == limot->m_hiLimit)) powered = 0;
        info->m_constraintError[srow] = btScalar(0.f);
        if (powered)
        {
			info->cfm[srow] = limot->m_normalCFM;
            if(!limit)
            {
				btScalar tag_vel = rotational ? limot->m_targetVelocity : -limot->m_targetVelocity;

				btScalar mot_fact = getMotorFactor(	limot->m_currentPosition, 
													limot->m_loLimit,
													limot->m_hiLimit, 
													tag_vel, 
													info->fps * limot->m_stopERP);
				info->m_constraintError[srow] += mot_fact * limot->m_targetVelocity;
                info->m_lowerLimit[srow] = -limot->m_maxMotorForce;
                info->m_upperLimit[srow] = limot->m_maxMotorForce;
            }
        }
        if(limit)
        {
            btScalar k = info->fps * limot->m_stopERP;
			if(!rotational)
			{
				info->m_constraintError[srow] += k * limot->m_currentLimitError;
			}
			else
			{
				info->m_constraintError[srow] += -k * limot->m_currentLimitError;
			}
			info->cfm[srow] = limot->m_stopCFM;
            if (limot->m_loLimit == limot->m_hiLimit)
            {   // limited low and high simultaneously
                info->m_lowerLimit[srow] = -SIMD_INFINITY;
                info->m_upperLimit[srow] = SIMD_INFINITY;
            }
            else
            {
                if (limit == 1)
                {
                    info->m_lowerLimit[srow] = 0;
                    info->m_upperLimit[srow] = SIMD_INFINITY;
                }
                else
                {
                    info->m_lowerLimit[srow] = -SIMD_INFINITY;
                    info->m_upperLimit[srow] = 0;
                }
                // deal with bounce
                if (limot->m_bounce > 0)
                {
                    // calculate joint velocity
                    btScalar vel;
                    if (rotational)
                    {
                        vel = angVelA.dot(ax1);
//make sure that if no body -> angVelB == zero vec
//                        if (body1)
                            vel -= angVelB.dot(ax1);
                    }
                    else
                    {
                        vel = linVelA.dot(ax1);
//make sure that if no body -> angVelB == zero vec
//                        if (body1)
                            vel -= linVelB.dot(ax1);
                    }
                    // only apply bounce if the velocity is incoming, and if the
                    // resulting c[] exceeds what we already have.
                    if (limit == 1)
                    {
                        if (vel < 0)
                        {
                            btScalar newc = -limot->m_bounce* vel;
                            if (newc > info->m_constraintError[srow]) 
								info->m_constraintError[srow] = newc;
                        }
                    }
                    else
                    {
                        if (vel > 0)
                        {
                            btScalar newc = -limot->m_bounce * vel;
                            if (newc < info->m_constraintError[srow]) 
								info->m_constraintError[srow] = newc;
                        }
                    }
                }
            }
        }
        return 1;
    }
    else return 0;
}